

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.hpp
# Opt level: O1

bool duckdb::string_t::StringComparisonOperators::GreaterThan(string_t *left,string_t *right)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  char *__s2;
  char *__s1;
  
  uVar1 = *(uint *)((long)&left->value + 4);
  uVar2 = *(uint *)((long)&right->value + 4);
  if (uVar1 == uVar2) {
    uVar1 = (left->value).pointer.length;
    uVar2 = (right->value).pointer.length;
    uVar3 = uVar1;
    if (uVar2 < uVar1) {
      uVar3 = uVar2;
    }
    if (uVar1 < 0xd) {
      __s1 = (char *)((long)&left->value + 4);
    }
    else {
      __s1 = (left->value).pointer.ptr;
    }
    if (uVar2 < 0xd) {
      __s2 = (char *)((long)&right->value + 4);
    }
    else {
      __s2 = (right->value).pointer.ptr;
    }
    iVar4 = switchD_011d81eb::default(__s1,__s2,(ulong)uVar3);
    return 0 < iVar4 || iVar4 == 0 && uVar2 < uVar1;
  }
  return (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) <
         (uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18);
}

Assistant:

const T Load(const_data_ptr_t ptr) {
	T ret;
	memcpy(&ret, ptr, sizeof(ret)); // NOLINT
	return ret;
}